

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TemporaryObject.cpp
# Opt level: O1

void __thiscall
chatra::TemporaryObject::setExplicitSuper(TemporaryObject *this,Reference targetRef,Class *cl)

{
  pointer pAVar1;
  
  this->type = ExplicitSuper;
  (this->targetRef).node = targetRef.node;
  this->cl = cl;
  this->hasName = false;
  this->hasArgs = false;
  this->hasSetArg = false;
  this->hasVarArgOp = false;
  pAVar1 = (this->args).
           super__Vector_base<chatra::ArgumentSpec,_std::allocator<chatra::ArgumentSpec>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((this->args).super__Vector_base<chatra::ArgumentSpec,_std::allocator<chatra::ArgumentSpec>_>.
      _M_impl.super__Vector_impl_data._M_finish != pAVar1) {
    (this->args).super__Vector_base<chatra::ArgumentSpec,_std::allocator<chatra::ArgumentSpec>_>.
    _M_impl.super__Vector_impl_data._M_finish = pAVar1;
  }
  return;
}

Assistant:

void TemporaryObject::setExplicitSuper(Reference targetRef, const Class* cl) {
	type = Type::ExplicitSuper;
	this->targetRef = targetRef;
	this->cl = cl;
	clearRestrictions();
}